

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O2

void deqp::gles3::Functional::evalTexture3DGradOffset(ShaderEvalContext *c,TexLookupParams *p)

{
  float s;
  float t;
  float r;
  float lod;
  Vector<int,_3> local_5c;
  undefined1 local_50 [32];
  tcu local_30 [8];
  float afStack_28 [2];
  
  s = c->in[0].m_data[0];
  t = c->in[0].m_data[1];
  r = c->in[0].m_data[2];
  lod = computeLodFromGrad3D(c);
  tcu::Vector<int,_3>::Vector(&local_5c,&p->offset);
  texture3DOffset((ShaderEvalContext *)local_50,s,t,r,lod,(IVec3 *)c);
  tcu::operator*((tcu *)(local_50 + 0x10),(Vector<float,_4> *)local_50,&p->scale);
  tcu::operator+(local_30,(Vector<float,_4> *)(local_50 + 0x10),&p->bias);
  *(tcu (*) [8])(c->color).m_data = local_30;
  *(float (*) [2])((c->color).m_data + 2) = afStack_28;
  return;
}

Assistant:

static void		evalTexture3DGradOffset			(gls::ShaderEvalContext& c, const TexLookupParams& p)	{ c.color = texture3DOffset(c, c.in[0].x(), c.in[0].y(), c.in[0].z(), computeLodFromGrad3D(c), p.offset)*p.scale + p.bias; }